

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

bool __thiscall
re2::Tester::TestCase(Tester *this,StringPiece *text,StringPiece *context,Anchor anchor)

{
  pointer ppTVar1;
  TestInstance *this_00;
  bool bVar2;
  bool bVar3;
  size_t i;
  ulong uVar4;
  
  bVar3 = true;
  for (uVar4 = 0;
      ppTVar1 = (this->v_).
                super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->v_).
                            super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
      uVar4 = uVar4 + 1) {
    this_00 = ppTVar1[uVar4];
    if (this_00->error_ == false) {
      bVar2 = TestInstance::RunCase(this_00,text,context,anchor);
    }
    else {
      bVar2 = false;
    }
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool Tester::TestCase(const StringPiece& text, const StringPiece& context,
                         Prog::Anchor anchor) {
  bool okay = true;
  for (size_t i = 0; i < v_.size(); i++)
    okay &= (!v_[i]->error() && v_[i]->RunCase(text, context, anchor));
  return okay;
}